

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVSTInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint RegNo;
  uint32_t uVar4;
  uint32_t RegNo_00;
  uint uVar5;
  DecodeStatus DVar6;
  uint Rd;
  uint Rm;
  uint Rn;
  uint wb;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Rn = 3;
  _wb = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Insn,0xc,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x16,1);
  RegNo = uVar2 | uVar3 << 4;
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,4,2);
  RegNo_00 = fieldFromInstruction_4(Address_local._4_4_,0,4);
  uVar5 = MCInst_getOpcode(pMStack_18);
  switch(uVar5) {
  case 0x761:
  case 0x762:
  case 0x764:
  case 0x765:
  case 0x766:
  case 0x767:
  case 0x76a:
  case 0x76b:
  case 0x76d:
  case 0x76e:
  case 0x76f:
  case 0x770:
  case 0x776:
  case 0x777:
  case 0x77c:
  case 0x77d:
  case 0x77e:
  case 0x77f:
  case 0x782:
  case 0x783:
  case 0x785:
  case 0x786:
  case 0x787:
  case 0x788:
  case 0x78a:
  case 0x78b:
  case 0x78d:
  case 0x78e:
  case 0x790:
  case 0x791:
  case 0x793:
  case 0x794:
  case 0x7b9:
  case 0x7ba:
  case 0x7bc:
  case 0x7bd:
  case 0x7bf:
  case 0x7c0:
  case 0x7c2:
  case 0x7c3:
  case 0x7c5:
  case 0x7c6:
  case 0x7c8:
  case 0x7c9:
  case 0x7ce:
  case 1999:
  case 0x7d4:
  case 0x7d5:
  case 0x7da:
  case 0x7db:
    if (RegNo_00 == 0xf) {
      return MCDisassembler_Fail;
    }
    MCOperand_CreateImm0(pMStack_18,0);
    break;
  default:
    break;
  case 0x802:
  case 0x806:
  case 0x80a:
  case 0x816:
  case 0x81b:
  case 0x820:
  case 0x852:
  case 0x856:
  case 0x85a:
  case 0x866:
  case 0x86b:
  case 0x870:
    DVar6 = DecodeGPRRegisterClass(pMStack_18,uVar2,(uint64_t)Decoder_local,_wb);
    _Var1 = Check(&Rn,DVar6);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  DVar6 = DecodeAddrMode6Operand(pMStack_18,uVar3 | uVar4 << 4,(uint64_t)Decoder_local,_wb);
  _Var1 = Check(&Rn,DVar6);
  if (!_Var1) {
    return MCDisassembler_Fail;
  }
  uVar5 = MCInst_getOpcode(pMStack_18);
  switch(uVar5) {
  case 0x761:
  case 0x764:
  case 0x766:
  case 0x76a:
  case 0x76d:
  case 0x76f:
  case 0x776:
  case 0x77c:
  case 0x77e:
  case 0x782:
  case 0x785:
  case 0x787:
  case 0x78a:
  case 0x78d:
  case 0x790:
  case 0x793:
  case 0x7b9:
  case 0x7bc:
  case 0x7bf:
  case 0x7c2:
  case 0x7c5:
  case 0x7c8:
  case 0x7ce:
  case 0x7d4:
  case 0x7da:
    break;
  default:
    if (RegNo_00 == 0xd) {
      MCOperand_CreateReg0(pMStack_18,0);
    }
    else if (RegNo_00 != 0xf) {
      DVar6 = DecodeGPRRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_wb);
      _Var1 = Check(&Rn,DVar6);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
  }
  uVar5 = MCInst_getOpcode(pMStack_18);
  if (0xb < uVar5 - 0x789) {
    if (uVar5 - 0x7b8 < 9) {
      DVar6 = DecodeDPairSpacedRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_wb);
      _Var1 = Check(&Rn,DVar6);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
      goto LAB_0016ecf8;
    }
    if (8 < uVar5 - 0x7c1) {
      DVar6 = DecodeDPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_wb);
      _Var1 = Check(&Rn,DVar6);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
      goto LAB_0016ecf8;
    }
  }
  DVar6 = DecodeDPairRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_wb);
  _Var1 = Check(&Rn,DVar6);
  if (!_Var1) {
    return MCDisassembler_Fail;
  }
LAB_0016ecf8:
  uVar5 = MCInst_getOpcode(pMStack_18);
  switch(uVar5) {
  case 0x7ff:
  case 0x802:
  case 0x803:
  case 0x806:
  case 0x807:
  case 0x80a:
  case 0x84f:
  case 0x852:
  case 0x853:
  case 0x856:
  case 0x857:
  case 0x85a:
    DVar6 = DecodeDPRRegisterClass(pMStack_18,RegNo + 1 & 0x1f,(uint64_t)Decoder_local,_wb);
    _Var1 = Check(&Rn,DVar6);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
    break;
  default:
    break;
  case 0x814:
  case 0x816:
  case 0x819:
  case 0x81b:
  case 0x81e:
  case 0x820:
  case 0x864:
  case 0x866:
  case 0x869:
  case 0x86b:
  case 0x86e:
  case 0x870:
    DVar6 = DecodeDPRRegisterClass(pMStack_18,RegNo + 2 & 0x1f,(uint64_t)Decoder_local,_wb);
    _Var1 = Check(&Rn,DVar6);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  uVar5 = MCInst_getOpcode(pMStack_18);
  switch(uVar5) {
  case 0x7ff:
  case 0x802:
  case 0x803:
  case 0x806:
  case 0x807:
  case 0x80a:
  case 0x84f:
  case 0x852:
  case 0x853:
  case 0x856:
  case 0x857:
  case 0x85a:
    DVar6 = DecodeDPRRegisterClass(pMStack_18,RegNo + 2 & 0x1f,(uint64_t)Decoder_local,_wb);
    _Var1 = Check(&Rn,DVar6);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
    break;
  default:
    break;
  case 0x814:
  case 0x816:
  case 0x819:
  case 0x81b:
  case 0x81e:
  case 0x820:
  case 0x864:
  case 0x866:
  case 0x869:
  case 0x86b:
  case 0x86e:
  case 0x870:
    DVar6 = DecodeDPRRegisterClass(pMStack_18,RegNo + 4 & 0x1f,(uint64_t)Decoder_local,_wb);
    _Var1 = Check(&Rn,DVar6);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  uVar5 = MCInst_getOpcode(pMStack_18);
  if ((((uVar5 == 0x84f) || (uVar5 - 0x852 < 2)) || (uVar5 - 0x856 < 2)) || (uVar5 == 0x85a)) {
    DVar6 = DecodeDPRRegisterClass(pMStack_18,RegNo + 3 & 0x1f,(uint64_t)Decoder_local,_wb);
    _Var1 = Check(&Rn,DVar6);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  else if ((((uVar5 == 0x864) || (uVar5 == 0x866)) ||
           ((uVar5 == 0x869 || ((uVar5 == 0x86b || (uVar5 == 0x86e)))))) || (uVar5 == 0x870)) {
    DVar6 = DecodeDPRRegisterClass(pMStack_18,RegNo + 6 & 0x1f,(uint64_t)Decoder_local,_wb);
    _Var1 = Check(&Rn,DVar6);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  return Rn;
}

Assistant:

static DecodeStatus DecodeVSTInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned wb, Rn, Rm;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	wb = fieldFromInstruction_4(Insn, 16, 4);
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rn |= fieldFromInstruction_4(Insn, 4, 2) << 4;
	Rm = fieldFromInstruction_4(Insn, 0, 4);

	// Writeback Operand
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST1d8wb_fixed:
		case ARM_VST1d16wb_fixed:
		case ARM_VST1d32wb_fixed:
		case ARM_VST1d64wb_fixed:
		case ARM_VST1d8wb_register:
		case ARM_VST1d16wb_register:
		case ARM_VST1d32wb_register:
		case ARM_VST1d64wb_register:
		case ARM_VST1q8wb_fixed:
		case ARM_VST1q16wb_fixed:
		case ARM_VST1q32wb_fixed:
		case ARM_VST1q64wb_fixed:
		case ARM_VST1q8wb_register:
		case ARM_VST1q16wb_register:
		case ARM_VST1q32wb_register:
		case ARM_VST1q64wb_register:
		case ARM_VST1d8Twb_fixed:
		case ARM_VST1d16Twb_fixed:
		case ARM_VST1d32Twb_fixed:
		case ARM_VST1d64Twb_fixed:
		case ARM_VST1d8Twb_register:
		case ARM_VST1d16Twb_register:
		case ARM_VST1d32Twb_register:
		case ARM_VST1d64Twb_register:
		case ARM_VST1d8Qwb_fixed:
		case ARM_VST1d16Qwb_fixed:
		case ARM_VST1d32Qwb_fixed:
		case ARM_VST1d64Qwb_fixed:
		case ARM_VST1d8Qwb_register:
		case ARM_VST1d16Qwb_register:
		case ARM_VST1d32Qwb_register:
		case ARM_VST1d64Qwb_register:
		case ARM_VST2d8wb_fixed:
		case ARM_VST2d16wb_fixed:
		case ARM_VST2d32wb_fixed:
		case ARM_VST2d8wb_register:
		case ARM_VST2d16wb_register:
		case ARM_VST2d32wb_register:
		case ARM_VST2q8wb_fixed:
		case ARM_VST2q16wb_fixed:
		case ARM_VST2q32wb_fixed:
		case ARM_VST2q8wb_register:
		case ARM_VST2q16wb_register:
		case ARM_VST2q32wb_register:
		case ARM_VST2b8wb_fixed:
		case ARM_VST2b16wb_fixed:
		case ARM_VST2b32wb_fixed:
		case ARM_VST2b8wb_register:
		case ARM_VST2b16wb_register:
		case ARM_VST2b32wb_register:
			if (Rm == 0xF)
				return MCDisassembler_Fail;
			MCOperand_CreateImm0(Inst, 0);
			break;
		case ARM_VST3d8_UPD:
		case ARM_VST3d16_UPD:
		case ARM_VST3d32_UPD:
		case ARM_VST3q8_UPD:
		case ARM_VST3q16_UPD:
		case ARM_VST3q32_UPD:
		case ARM_VST4d8_UPD:
		case ARM_VST4d16_UPD:
		case ARM_VST4d32_UPD:
		case ARM_VST4q8_UPD:
		case ARM_VST4q16_UPD:
		case ARM_VST4q32_UPD:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, wb, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// AddrMode6 Base (register+alignment)
	if (!Check(&S, DecodeAddrMode6Operand(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	// AddrMode6 Offset (register)
	switch (MCInst_getOpcode(Inst)) {
		default:
			if (Rm == 0xD)
				MCOperand_CreateReg0(Inst, 0);
			else if (Rm != 0xF) {
				if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
					return MCDisassembler_Fail;
			}
			break;
		case ARM_VST1d8wb_fixed:
		case ARM_VST1d16wb_fixed:
		case ARM_VST1d32wb_fixed:
		case ARM_VST1d64wb_fixed:
		case ARM_VST1q8wb_fixed:
		case ARM_VST1q16wb_fixed:
		case ARM_VST1q32wb_fixed:
		case ARM_VST1q64wb_fixed:
		case ARM_VST1d8Twb_fixed:
		case ARM_VST1d16Twb_fixed:
		case ARM_VST1d32Twb_fixed:
		case ARM_VST1d64Twb_fixed:
		case ARM_VST1d8Qwb_fixed:
		case ARM_VST1d16Qwb_fixed:
		case ARM_VST1d32Qwb_fixed:
		case ARM_VST1d64Qwb_fixed:
		case ARM_VST2d8wb_fixed:
		case ARM_VST2d16wb_fixed:
		case ARM_VST2d32wb_fixed:
		case ARM_VST2q8wb_fixed:
		case ARM_VST2q16wb_fixed:
		case ARM_VST2q32wb_fixed:
		case ARM_VST2b8wb_fixed:
		case ARM_VST2b16wb_fixed:
		case ARM_VST2b32wb_fixed:
			break;
	}


	// First input register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST1q16:
		case ARM_VST1q32:
		case ARM_VST1q64:
		case ARM_VST1q8:
		case ARM_VST1q16wb_fixed:
		case ARM_VST1q16wb_register:
		case ARM_VST1q32wb_fixed:
		case ARM_VST1q32wb_register:
		case ARM_VST1q64wb_fixed:
		case ARM_VST1q64wb_register:
		case ARM_VST1q8wb_fixed:
		case ARM_VST1q8wb_register:
		case ARM_VST2d16:
		case ARM_VST2d32:
		case ARM_VST2d8:
		case ARM_VST2d16wb_fixed:
		case ARM_VST2d16wb_register:
		case ARM_VST2d32wb_fixed:
		case ARM_VST2d32wb_register:
		case ARM_VST2d8wb_fixed:
		case ARM_VST2d8wb_register:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VST2b16:
		case ARM_VST2b32:
		case ARM_VST2b8:
		case ARM_VST2b16wb_fixed:
		case ARM_VST2b16wb_register:
		case ARM_VST2b32wb_fixed:
		case ARM_VST2b32wb_register:
		case ARM_VST2b8wb_fixed:
		case ARM_VST2b8wb_register:
			if (!Check(&S, DecodeDPairSpacedRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	// Second input register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST3d8:
		case ARM_VST3d16:
		case ARM_VST3d32:
		case ARM_VST3d8_UPD:
		case ARM_VST3d16_UPD:
		case ARM_VST3d32_UPD:
		case ARM_VST4d8:
		case ARM_VST4d16:
		case ARM_VST4d32:
		case ARM_VST4d8_UPD:
		case ARM_VST4d16_UPD:
		case ARM_VST4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+1)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VST3q8:
		case ARM_VST3q16:
		case ARM_VST3q32:
		case ARM_VST3q8_UPD:
		case ARM_VST3q16_UPD:
		case ARM_VST3q32_UPD:
		case ARM_VST4q8:
		case ARM_VST4q16:
		case ARM_VST4q32:
		case ARM_VST4q8_UPD:
		case ARM_VST4q16_UPD:
		case ARM_VST4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Third input register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST3d8:
		case ARM_VST3d16:
		case ARM_VST3d32:
		case ARM_VST3d8_UPD:
		case ARM_VST3d16_UPD:
		case ARM_VST3d32_UPD:
		case ARM_VST4d8:
		case ARM_VST4d16:
		case ARM_VST4d32:
		case ARM_VST4d8_UPD:
		case ARM_VST4d16_UPD:
		case ARM_VST4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VST3q8:
		case ARM_VST3q16:
		case ARM_VST3q32:
		case ARM_VST3q8_UPD:
		case ARM_VST3q16_UPD:
		case ARM_VST3q32_UPD:
		case ARM_VST4q8:
		case ARM_VST4q16:
		case ARM_VST4q32:
		case ARM_VST4q8_UPD:
		case ARM_VST4q16_UPD:
		case ARM_VST4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+4)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	// Fourth input register
	switch (MCInst_getOpcode(Inst)) {
		case ARM_VST4d8:
		case ARM_VST4d16:
		case ARM_VST4d32:
		case ARM_VST4d8_UPD:
		case ARM_VST4d16_UPD:
		case ARM_VST4d32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+3)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VST4q8:
		case ARM_VST4q16:
		case ARM_VST4q32:
		case ARM_VST4q8_UPD:
		case ARM_VST4q16_UPD:
		case ARM_VST4q32_UPD:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+6)%32, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	return S;
}